

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement
          (cmNinjaNormalTargetGenerator *this,string *config,string *fileConfig,string *outputDir,
          string *output)

{
  PositionType *pPVar1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmGeneratorTarget *pcVar4;
  pointer pcVar5;
  size_t sVar6;
  cmLocalNinjaGenerator *pcVar7;
  cmLocalNinjaGenerator *this_00;
  cmMakefile *this_01;
  size_type sVar8;
  _Alloc_hider _Var9;
  int iVar10;
  TargetType TVar11;
  int iVar12;
  cmGlobalNinjaGenerator *pcVar13;
  string *psVar14;
  char *pcVar15;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  char *__s;
  size_t sVar18;
  mapped_type *pmVar19;
  cmGeneratedFileStream *os;
  size_type sVar20;
  bool bVar21;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  string_view source;
  string_view source_00;
  string_view source_01;
  string_view source_02;
  string_view source_03;
  bool usedResponseFile;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcStack_470;
  undefined1 local_468 [16];
  pointer local_458;
  string *local_450;
  size_type local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_440;
  string *local_438;
  undefined8 local_430;
  char *local_428;
  undefined8 local_420;
  cmGlobalNinjaGenerator *local_410;
  key_type local_408;
  pointer local_3e8;
  undefined8 local_3e0;
  cmGeneratorTarget *local_3d8;
  string *local_3d0;
  string objPath;
  string local_3a8;
  string targetOutputImplib;
  cmNinjaLinkLineDeviceComputer linkLineComputer;
  Names tgtNames;
  string langFlags;
  string linkPath;
  string frameworkPath;
  string local_1b0;
  string local_190;
  undefined1 local_170 [32];
  key_type local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130 [3];
  pointer local_e8;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_e0;
  pointer local_d8;
  pointer local_d0;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcStack_c8;
  pointer local_c0;
  cmNinjaDeps local_b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string createRule;
  
  pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  local_3d0 = output;
  local_410 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetFullPath((string *)local_170,pcVar4,config,ImportLibraryArtifact,false);
  pcVar13 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  psVar14 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar13,(string *)local_170);
  targetOutputImplib._M_dataplus._M_p = (pointer)&targetOutputImplib.field_2;
  pcVar5 = (psVar14->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&targetOutputImplib,pcVar5,pcVar5 + psVar14->_M_string_length);
  if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_170._0_8_ !=
      (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_170 + 0x10)) {
    operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
  }
  sVar6 = config->_M_string_length;
  local_3d8 = pcVar4;
  if (sVar6 == fileConfig->_M_string_length) {
    if (sVar6 != 0) {
      iVar10 = bcmp((config->_M_dataplus)._M_p,(fileConfig->_M_dataplus)._M_p,sVar6);
      if (iVar10 != 0) goto LAB_00484a5d;
    }
  }
  else {
LAB_00484a5d:
    pcVar7 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    (*(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[0x10])(&usedResponseFile,pcVar7,pcVar4);
    (*(local_410->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
      [0x4d])(&linkLineComputer,local_410,fileConfig);
    local_170._0_8_ = pcStack_470;
    local_170._8_8_ = _usedResponseFile;
    local_170._24_8_ =
         linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
         DirectoryState.Tree;
    local_150._M_dataplus._M_p =
         (pointer)linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                  _vptr_cmLinkLineComputer;
    local_150.field_2._M_allocated_capacity = 1;
    local_150.field_2._8_8_ =
         (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
    local_130[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    views._M_len = 3;
    views._M_array = (iterator)local_170;
    local_170._16_8_ = &usedResponseFile;
    local_150._M_string_length = (size_type)&linkLineComputer;
    cmCatViews(&tgtNames.Base,views);
    pPVar1 = &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
              DirectoryState.Position;
    if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
        _vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
      operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                      _vptr_cmLinkLineComputer,
                      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                      StateDir.DirectoryState.Position + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_usedResponseFile !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468) {
      operator_delete(_usedResponseFile,local_468._0_8_ + 1);
    }
    (*(local_410->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
      [0x18])(local_170,local_410,outputDir,fileConfig);
    std::__cxx11::string::operator=((string *)&tgtNames,(string *)local_170);
    if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_170._0_8_ !=
        (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_170 + 0x10)) {
      operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
    }
    _Var9._M_p = tgtNames.Base._M_dataplus._M_p;
    sVar6 = outputDir->_M_string_length;
    if (sVar6 == tgtNames.Base._M_string_length) {
      if (sVar6 != 0) {
        iVar10 = bcmp((outputDir->_M_dataplus)._M_p,tgtNames.Base._M_dataplus._M_p,sVar6);
        if (iVar10 != 0) goto LAB_00484bbb;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var9._M_p != &tgtNames.Base.field_2) {
        operator_delete(_Var9._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00485ca7;
    }
LAB_00484bbb:
    cmGeneratorTarget::GetFullName((string *)local_170,local_3d8,config,ImportLibraryArtifact);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._8_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar21 = true;
    }
    else {
      cmGeneratorTarget::GetFullName
                ((string *)&usedResponseFile,local_3d8,fileConfig,ImportLibraryArtifact);
      if (pcStack_470 == (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0) {
        bVar21 = true;
      }
      else {
        cmGeneratorTarget::GetFullPath
                  ((string *)&linkLineComputer,local_3d8,fileConfig,ImportLibraryArtifact,false);
        pcVar13 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        psVar14 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar13,(string *)&linkLineComputer);
        bVar21 = true;
        if (targetOutputImplib._M_string_length == psVar14->_M_string_length) {
          if (targetOutputImplib._M_string_length == 0) {
            bVar21 = false;
          }
          else {
            iVar10 = bcmp(targetOutputImplib._M_dataplus._M_p,(psVar14->_M_dataplus)._M_p,
                          targetOutputImplib._M_string_length);
            bVar21 = iVar10 != 0;
          }
        }
        if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
            _vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
          operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                          _vptr_cmLinkLineComputer,
                          linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                          StateDir.DirectoryState.Position + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468) {
        operator_delete(_usedResponseFile,local_468._0_8_ + 1);
      }
    }
    if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_170._0_8_ !=
        (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_170 + 0x10)) {
      operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
      operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1
                     );
    }
    if (!bVar21) goto LAB_00485ca7;
  }
  LanguageLinkerDeviceRule(&local_190,this,config);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_170._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_170._16_8_ = local_170._16_8_ & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p == &local_190.field_2) {
    local_150.field_2._8_8_ = local_190.field_2._8_8_;
  }
  else {
    local_150._M_dataplus._M_p = local_190._M_dataplus._M_p;
  }
  local_150.field_2._M_allocated_capacity._1_7_ = local_190.field_2._M_allocated_capacity._1_7_;
  local_150.field_2._M_local_buf[0] = local_190.field_2._M_local_buf[0];
  local_150._M_string_length = local_190._M_string_length;
  local_190._M_string_length = 0;
  local_190.field_2._M_local_buf[0] = '\0';
  p_Var2 = &local_a0._M_t._M_impl.super__Rb_tree_header;
  local_a0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  local_170._0_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_170 + 0x10);
  memset(local_130,0,0x90);
  local_a0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._M_p = (pointer)&local_60;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_a0._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_a0._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  pcVar15 = GetVisibleTypeName(this);
  tgtNames.Base._M_dataplus._M_p = &DAT_00000009;
  tgtNames.Base._M_string_length = (size_type)anon_var_dwarf_1b1d793;
  tgtNames.Base.field_2._M_allocated_capacity = 0;
  tgtNames.Base.field_2._8_8_ = strlen(pcVar15);
  tgtNames.Output._M_string_length = 0;
  local_468._0_8_ = (long)local_468 + 8;
  _usedResponseFile = (pointer)0x0;
  pcStack_470 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x1;
  local_468[8] = 0x20;
  tgtNames.Output.field_2._M_allocated_capacity = 1;
  tgtNames.Real._M_dataplus._M_p = (pointer)0x0;
  tgtNames.Real.field_2._M_allocated_capacity = (size_type)(local_3d0->_M_dataplus)._M_p;
  tgtNames.Real._M_string_length = local_3d0->_M_string_length;
  tgtNames.Real.field_2._8_8_ = 0;
  views_00._M_len = 4;
  views_00._M_array = (iterator)&tgtNames;
  tgtNames.Output._M_dataplus._M_p = pcVar15;
  tgtNames.Output.field_2._8_8_ = local_468._0_8_;
  cmCatViews((string *)&linkLineComputer,views_00);
  std::__cxx11::string::operator=((string *)local_170,(string *)&linkLineComputer);
  pcVar4 = local_3d8;
  if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer !=
      (_func_int **)
      &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
       DirectoryState.Position) {
    operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    _vptr_cmLinkLineComputer,
                    linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    StateDir.DirectoryState.Position + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_130,local_3d0);
  cmNinjaTargetGenerator::GetObjects
            ((cmNinjaDeps *)&usedResponseFile,&this->super_cmNinjaTargetGenerator,config);
  tgtNames.Base.field_2._M_allocated_capacity = (size_type)local_d8;
  tgtNames.Base._M_string_length = (size_type)pcStack_e0;
  tgtNames.Base._M_dataplus._M_p = (pointer)local_e8;
  local_d8 = (pointer)local_468._0_8_;
  local_e8 = (pointer)_usedResponseFile;
  pcStack_e0 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)pcStack_470;
  _usedResponseFile = (pointer)0x0;
  pcStack_470 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  local_468._0_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tgtNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&usedResponseFile);
  cmGeneratorTarget::GetLinkerLanguage
            (&tgtNames.Base,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  cmNinjaTargetGenerator::ComputeLinkDeps
            ((cmNinjaDeps *)&linkLineComputer,&this->super_cmNinjaTargetGenerator,&tgtNames.Base,
             config,false);
  local_468._0_8_ = local_c0;
  pcStack_470 = pcStack_c8;
  _usedResponseFile = (pointer)local_d0;
  local_c0 = (pointer)linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                      StateDir.DirectoryState.Position;
  local_d0 = (pointer)linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                      _vptr_cmLinkLineComputer;
  pcStack_c8 = linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
               DirectoryState.Tree;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)0x0;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Position = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&usedResponseFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&linkLineComputer);
  paVar3 = &tgtNames.Base.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar3) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  linkPath.field_2._M_local_buf[0] = '\0';
  cmGeneratorTarget::GetLinkerLanguage
            (&tgtNames.Base,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  cmGeneratorTarget::GetCreateRuleVariable(&createRule,pcVar4,&tgtNames.Base,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar3) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  source._M_str = (local_3d0->_M_dataplus)._M_p;
  source._M_len = local_3d0->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&tgtNames.Base,(cmOutputConverter *)pcVar7,source,SHELL,false);
  _usedResponseFile = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"TARGET_FILE","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_a0,(key_type *)&usedResponseFile);
  std::__cxx11::string::operator=((string *)pmVar16,(string *)&tgtNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468) {
    operator_delete(_usedResponseFile,local_468._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar3) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  this_00 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  cmLocalGenerator::GetStateSnapshot
            ((cmStateSnapshot *)&usedResponseFile,(cmLocalGenerator *)this_00);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&tgtNames,(cmStateSnapshot *)&usedResponseFile);
  cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
            (&linkLineComputer,(cmOutputConverter *)this_00,(cmStateDirectory *)&tgtNames,local_410)
  ;
  iVar10 = (*(local_410->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x28])();
  cmLinkLineComputer::SetUseNinjaMulti((cmLinkLineComputer *)&linkLineComputer,SUB41(iVar10,0));
  tgtNames.Base._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"LINK_LIBRARIES","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_a0,&tgtNames.Base);
  _usedResponseFile = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_FLAGS","");
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_a0,(key_type *)&usedResponseFile);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)pcVar7,&linkLineComputer.super_cmLinkLineDeviceComputer,config,
             pmVar16,pmVar17,&frameworkPath,&linkPath,pcVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468) {
    operator_delete(_usedResponseFile,local_468._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar3) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  tgtNames.Base._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"JOB_POOL_LINK","");
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this->super_cmNinjaTargetGenerator,&tgtNames.Base,pcVar4,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar3) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  cmCommonTargetGenerator::GetManifests(&tgtNames.Base,(cmCommonTargetGenerator *)this,config);
  _usedResponseFile = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"MANIFESTS","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_a0,(key_type *)&usedResponseFile);
  std::__cxx11::string::operator=((string *)pmVar16,(string *)&tgtNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468) {
    operator_delete(_usedResponseFile,local_468._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar3) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&tgtNames.Base,&frameworkPath,&linkPath);
  _usedResponseFile = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_PATH","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_a0,(key_type *)&usedResponseFile);
  std::__cxx11::string::operator=((string *)pmVar16,(string *)&tgtNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468) {
    operator_delete(_usedResponseFile,local_468._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar3) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
  langFlags._M_string_length = 0;
  langFlags.field_2._M_local_buf[0] = '\0';
  tgtNames.Base._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"CUDA","");
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)pcVar7,&langFlags,pcVar4,&tgtNames.Base,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar3) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  tgtNames.Base._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"LANGUAGE_COMPILE_FLAGS","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_a0,&tgtNames.Base);
  std::__cxx11::string::_M_assign((string *)pmVar16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar3) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  TargetNames(&tgtNames,this,config);
  bVar21 = cmGeneratorTarget::HasSOName(pcVar4,config);
  if (bVar21) {
    this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    cmGeneratorTarget::GetLinkerLanguage
              ((string *)&usedResponseFile,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               config);
    __s = cmMakefile::GetSONameFlag(this_01,(string *)&usedResponseFile);
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"SONAME_FLAG","");
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_a0,&local_408);
    pcVar15 = (char *)pmVar16->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)pmVar16,0,pcVar15,(ulong)__s);
    paVar3 = &local_408.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar3) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = local_3d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_usedResponseFile !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468) {
      operator_delete(_usedResponseFile,local_468._0_8_ + 1);
    }
    source_00._M_str = tgtNames.SharedObject._M_dataplus._M_p;
    source_00._M_len = tgtNames.SharedObject._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&usedResponseFile,(cmOutputConverter *)pcVar7,source_00,SHELL,false);
    local_408._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"SONAME","");
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_a0,&local_408);
    std::__cxx11::string::operator=((string *)pmVar16,(string *)&usedResponseFile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar3) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_usedResponseFile !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468) {
      operator_delete(_usedResponseFile,local_468._0_8_ + 1);
    }
    TVar11 = cmGeneratorTarget::GetType(pcVar4);
    if (TVar11 == SHARED_LIBRARY) {
      cmGeneratorTarget::GetInstallNameDirForBuildTree
                ((string *)&usedResponseFile,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      if (pcStack_470 != (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0) {
        source_01._M_str = _usedResponseFile;
        source_01._M_len = (size_t)pcStack_470;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&local_408,(cmOutputConverter *)pcVar7,source_01,SHELL,false);
        objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"INSTALLNAME_DIR","");
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&local_a0,&objPath);
        std::__cxx11::string::operator=((string *)pmVar16,(string *)&local_408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objPath._M_dataplus._M_p != &objPath.field_2) {
          operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != paVar3) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468) {
        operator_delete(_usedResponseFile,local_468._0_8_ + 1);
      }
    }
  }
  if (tgtNames.ImportLibrary._M_string_length != 0) {
    source_02._M_str = targetOutputImplib._M_dataplus._M_p;
    source_02._M_len = targetOutputImplib._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&usedResponseFile,(cmOutputConverter *)pcVar7,source_02,SHELL,false);
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"TARGET_IMPLIB","");
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_a0,&local_408);
    std::__cxx11::string::_M_assign((string *)pmVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this->super_cmNinjaTargetGenerator,&targetOutputImplib);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_usedResponseFile !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468) {
      operator_delete(_usedResponseFile,local_468._0_8_ + 1);
    }
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&local_408,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  (*(local_410->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d]
  )(&local_3a8,local_410,config);
  _usedResponseFile = (pointer)local_408._M_string_length;
  pcStack_470 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
                local_408._M_dataplus._M_p;
  local_468._8_8_ = local_3a8._M_string_length;
  local_458 = local_3a8._M_dataplus._M_p;
  views_01._M_len = 2;
  views_01._M_array = (iterator)&usedResponseFile;
  local_468._0_8_ = &local_408;
  local_450 = &local_3a8;
  cmCatViews(&objPath,views_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_408.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar3) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar13 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  psVar14 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar13,&objPath);
  source_03._M_str = (psVar14->_M_dataplus)._M_p;
  source_03._M_len = psVar14->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)&usedResponseFile,(cmOutputConverter *)pcVar7,source_03,SHELL,false);
  local_408._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"OBJECT_DIR","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_a0,&local_408);
  std::__cxx11::string::operator=((string *)pmVar16,(string *)&usedResponseFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar3) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468) {
    operator_delete(_usedResponseFile,(ulong)(local_468._0_8_ + 1));
  }
  cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&objPath);
  cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
            (&this->super_cmNinjaTargetGenerator,&local_a0,config);
  _usedResponseFile = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_LIBRARIES","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_a0,(key_type *)&usedResponseFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468) {
    operator_delete(_usedResponseFile,(ulong)(local_468._0_8_ + 1));
  }
  _usedResponseFile = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_PATH","");
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_a0,(key_type *)&usedResponseFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468) {
    operator_delete(_usedResponseFile,(ulong)(local_468._0_8_ + 1));
  }
  if (local_410->UsingGCCOnWindows == true) {
    sVar8 = pmVar16->_M_string_length;
    if (sVar8 != 0) {
      pcVar5 = (pmVar16->_M_dataplus)._M_p;
      sVar20 = 0;
      do {
        if (pcVar5[sVar20] == '\\') {
          pcVar5[sVar20] = '/';
        }
        sVar20 = sVar20 + 1;
      } while (sVar8 != sVar20);
    }
    sVar8 = pmVar17->_M_string_length;
    if (sVar8 != 0) {
      pcVar5 = (pmVar17->_M_dataplus)._M_p;
      sVar20 = 0;
      do {
        if (pcVar5[sVar20] == '\\') {
          pcVar5[sVar20] = '/';
        }
        sVar20 = sVar20 + 1;
      } while (sVar8 != sVar20);
    }
  }
  sVar18 = cmSystemTools::CalculateCommandLineLengthLimit();
  pmVar19 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&local_410->RuleCmdLength,(key_type *)(local_170 + 0x20));
  iVar10 = *pmVar19;
  psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(local_3d8);
  iVar12 = (*(local_410->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x28])();
  if ((char)iVar12 == '\0') {
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
  }
  else {
    _usedResponseFile = (pointer)0x0;
    pcStack_470 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x1;
    local_468._0_8_ =
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468)->_M_local_buf + 8;
    local_468[8] = 0x2e;
    local_408._M_dataplus._M_p = (pointer)0x1;
    local_408.field_2._M_allocated_capacity = 0;
    local_3e8 = (config->_M_dataplus)._M_p;
    local_408.field_2._8_8_ = config->_M_string_length;
    local_3e0 = 0;
    views_02._M_len = 2;
    views_02._M_array = (iterator)&local_408;
    local_408._M_string_length = local_468._0_8_;
    cmCatViews(&local_1b0,views_02);
  }
  _usedResponseFile = (pointer)0xb;
  pcStack_470 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x8cb32a;
  local_468._0_8_ = 0;
  local_458 = (psVar14->_M_dataplus)._M_p;
  local_468._8_8_ = psVar14->_M_string_length;
  local_450 = (string *)0x0;
  local_438 = &local_1b0;
  local_448 = local_1b0._M_string_length;
  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p;
  local_430 = 4;
  local_428 = ".rsp";
  local_420 = 0;
  views_03._M_len = 4;
  views_03._M_array = (iterator)&usedResponseFile;
  cmCatViews(&local_3a8,views_03);
  pcVar13 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar13,&local_3a8);
  std::__cxx11::string::_M_assign((string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &local_b8,config,config,DependOnTargetArtifact);
  _usedResponseFile = _usedResponseFile & 0xffffffffffffff00;
  os = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild
            (local_410,(ostream *)os,(cmNinjaBuild *)local_170,(int)sVar18 - iVar10,
             &usedResponseFile);
  WriteNvidiaDeviceLinkRule(this,usedResponseFile,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
  }
  cmGeneratorTarget::Names::~Names(&tgtNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)langFlags._M_dataplus._M_p != &langFlags.field_2) {
    operator_delete(langFlags._M_dataplus._M_p,
                    CONCAT71(langFlags.field_2._M_allocated_capacity._1_7_,
                             langFlags.field_2._M_local_buf[0]) + 1);
  }
  cmLinkLineDeviceComputer::~cmLinkLineDeviceComputer
            (&linkLineComputer.super_cmLinkLineDeviceComputer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)createRule._M_dataplus._M_p != &createRule.field_2) {
    operator_delete(createRule._M_dataplus._M_p,createRule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
    operator_delete(linkPath._M_dataplus._M_p,
                    CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                             linkPath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
    operator_delete(frameworkPath._M_dataplus._M_p,
                    CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                             frameworkPath.field_2._M_local_buf[0]) + 1);
  }
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_170);
LAB_00485ca7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutputImplib._M_dataplus._M_p != &targetOutputImplib.field_2) {
    operator_delete(targetOutputImplib._M_dataplus._M_p,
                    targetOutputImplib.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement(
  const std::string& config, const std::string& fileConfig,
  const std::string& outputDir, const std::string& output)
{
  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();
  cmGlobalNinjaGenerator* globalGen = this->GetGlobalGenerator();

  std::string targetOutputImplib = this->ConvertToNinjaPath(
    genTarget->GetFullPath(config, cmStateEnums::ImportLibraryArtifact));

  if (config != fileConfig) {
    std::string targetOutputFileConfigDir =
      cmStrCat(this->GetLocalGenerator()->GetTargetDirectory(genTarget),
               globalGen->ConfigDirectory(fileConfig), "/");
    targetOutputFileConfigDir =
      globalGen->ExpandCFGIntDir(outputDir, fileConfig);
    if (outputDir == targetOutputFileConfigDir) {
      return;
    }

    if (!genTarget->GetFullName(config, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        !genTarget
           ->GetFullName(fileConfig, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        targetOutputImplib ==
          this->ConvertToNinjaPath(genTarget->GetFullPath(
            fileConfig, cmStateEnums::ImportLibraryArtifact))) {
      return;
    }
  }

  // Compute the comment.
  cmNinjaBuild build(this->LanguageLinkerDeviceRule(config));
  build.Comment =
    cmStrCat("Link the ", this->GetVisibleTypeName(), ' ', output);

  cmNinjaVars& vars = build.Variables;

  // Compute outputs.
  build.Outputs.push_back(output);
  // Compute specific libraries to link with.
  build.ExplicitDeps = this->GetObjects(config);
  build.ImplicitDeps =
    this->ComputeLinkDeps(this->TargetLinkLanguage(config), config);

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule =
    genTarget->GetCreateRuleVariable(this->TargetLinkLanguage(config), config);
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(output, cmOutputConverter::SHELL);

  cmNinjaLinkLineDeviceComputer linkLineComputer(
    this->GetLocalGenerator(),
    this->GetLocalGenerator()->GetStateSnapshot().GetDirectory(), globalGen);
  linkLineComputer.SetUseNinjaMulti(globalGen->IsMultiConfig());

  localGen.GetDeviceLinkFlags(linkLineComputer, config, vars["LINK_LIBRARIES"],
                              vars["LINK_FLAGS"], frameworkPath, linkPath,
                              genTarget);

  this->addPoolNinjaVariable("JOB_POOL_LINK", genTarget, vars);

  vars["MANIFESTS"] = this->GetManifests(config);

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute language specific link flags.
  std::string langFlags;
  localGen.AddLanguageFlagsForLinking(langFlags, genTarget, "CUDA", config);
  vars["LANGUAGE_COMPILE_FLAGS"] = langFlags;

  auto const tgtNames = this->TargetNames(config);
  if (genTarget->HasSOName(config)) {
    vars["SONAME_FLAG"] =
      this->GetMakefile()->GetSONameFlag(this->TargetLinkLanguage(config));
    vars["SONAME"] = localGen.ConvertToOutputFormat(tgtNames.SharedObject,
                                                    cmOutputConverter::SHELL);
    if (genTarget->GetType() == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(config);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  if (!tgtNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    this->EnsureParentDirectoryExists(targetOutputImplib);
  }

  const std::string objPath =
    cmStrCat(this->GetGeneratorTarget()->GetSupportDirectory(),
             globalGen->ConfigDirectory(config));

  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  this->EnsureDirectoryExists(objPath);

  this->SetMsvcTargetPdbVariable(vars, config);

  std::string& linkLibraries = vars["LINK_LIBRARIES"];
  std::string& link_path = vars["LINK_PATH"];
  if (globalGen->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  // Device linking currently doesn't support response files so
  // do not check if the user has explicitly forced a response file.
  int const commandLineLengthLimit =
    static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
    globalGen->GetRuleCmdLength(build.Rule);

  build.RspFile = this->ConvertToNinjaPath(
    cmStrCat("CMakeFiles/", genTarget->GetName(),
             globalGen->IsMultiConfig() ? cmStrCat('.', config) : "", ".rsp"));

  // Gather order-only dependencies.
  this->GetLocalGenerator()->AppendTargetDepends(
    this->GetGeneratorTarget(), build.OrderOnlyDeps, config, config,
    DependOnTargetArtifact);

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen->WriteBuild(this->GetCommonFileStream(), build,
                        commandLineLengthLimit, &usedResponseFile);
  this->WriteNvidiaDeviceLinkRule(usedResponseFile, config);
}